

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_quaternion rf_quaternion_transform(rf_quaternion q,rf_mat mat)

{
  rf_quaternion rVar1;
  undefined4 local_28;
  undefined4 uStack_24;
  rf_quaternion q_local;
  rf_quaternion result;
  
  local_28 = q.x;
  uStack_24 = q.y;
  q_local.x = q.z;
  q_local.y = q.w;
  rVar1.y = mat.m13 * q_local.y + mat.m9 * q_local.x + mat.m1 * local_28 + mat.m5 * uStack_24;
  rVar1.x = mat.m12 * q_local.y + mat.m8 * q_local.x + mat.m0 * local_28 + mat.m4 * uStack_24;
  rVar1.z = mat.m14 * q_local.y + mat.m10 * q_local.x + mat.m2 * local_28 + mat.m6 * uStack_24;
  rVar1.w = mat.m15 * q_local.y + mat.m11 * q_local.x + mat.m3 * local_28 + mat.m7 * uStack_24;
  return rVar1;
}

Assistant:

RF_API rf_quaternion rf_quaternion_transform(rf_quaternion q, rf_mat mat)
{
    rf_quaternion result = {0};

    result.x = mat.m0 * q.x + mat.m4 * q.y + mat.m8 * q.z + mat.m12 * q.w;
    result.y = mat.m1 * q.x + mat.m5 * q.y + mat.m9 * q.z + mat.m13 * q.w;
    result.z = mat.m2 * q.x + mat.m6 * q.y + mat.m10 * q.z + mat.m14 * q.w;
    result.w = mat.m3 * q.x + mat.m7 * q.y + mat.m11 * q.z + mat.m15 * q.w;

    return result;
}